

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

QRect __thiscall
QStyleSheetStyle::subElementRect(QStyleSheetStyle *this,SubElement se,QStyleOption *opt,QWidget *w)

{
  QRect *pQVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined1 *puVar9;
  QStyleSheetStyle *pQVar10;
  bool bVar11;
  bool bVar12;
  QStyle *pQVar13;
  QTabBar *this_00;
  QStyleOption *pQVar14;
  QStyleOptionViewItem *other;
  undefined8 uVar15;
  QSize QVar16;
  QStyleOptionButton *pQVar17;
  QPalette *pQVar18;
  undefined4 uVar19;
  int iVar20;
  SubElement sr;
  LayoutDirection LVar21;
  QRenderRule *this_01;
  long lVar22;
  int iVar23;
  QStyleOptionTab *other_00;
  long in_FS_OFFSET;
  QRect QVar24;
  undefined1 auVar25 [16];
  QSize sz;
  QRenderRule subRule2_1;
  QRenderRule subRule;
  QRenderRule rule;
  undefined1 *local_2e0;
  undefined1 local_2d8 [12];
  Representation RStack_2cc;
  undefined1 local_2c8 [12];
  Representation RStack_2bc;
  undefined1 *local_2b8;
  undefined1 *puStack_2b0;
  undefined1 local_2a8 [12];
  Representation RStack_29c;
  undefined1 local_298 [16];
  undefined1 *local_288;
  QHash<QString,_QVariant> QStack_280;
  QSharedDataPointer<QStyleSheetPaletteData> local_278;
  QSharedDataPointer<QStyleSheetBoxData> QStack_270;
  QSharedDataPointer<QStyleSheetBackgroundData> local_268;
  QSharedDataPointer<QStyleSheetBorderData> QStack_260;
  QSize local_258;
  QSharedDataPointer<QStyleSheetGeometryData> QStack_250;
  QSharedDataPointer<QStyleSheetPositionData> local_248;
  QSize QStack_240;
  QSharedDataPointer<QStyleSheetImageData> local_238 [2];
  QPainterPath local_228 [80];
  undefined1 local_1d8 [144];
  QRenderRule local_148;
  QRenderRule local_c0;
  long local_38;
  
  pQVar10 = globalStyleSheetStyle;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (globalStyleSheetStyle != (QStyleSheetStyle *)this &&
      globalStyleSheetStyle != (QStyleSheetStyle *)0x0) {
    pQVar13 = baseStyle(this);
    _local_2c8 = (QRect)(**(code **)(*(long *)pQVar13 + 0xc0))(pQVar13,se,opt,w);
    goto LAB_0036e987;
  }
  if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)this;
  }
  memset(&local_c0,0xaa,0x88);
  iVar23 = 0;
  renderRule(&local_c0,this,&w->super_QObject,opt,0);
  bVar11 = true;
  pQVar17 = (QStyleOptionButton *)opt;
  switch(se) {
  case SE_PushButtonContents:
  case SE_PushButtonFocusRect:
  case SE_PushButtonBevel:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (opt->type != 2)) {
      pQVar17 = (QStyleOptionButton *)0x0;
    }
    if (pQVar17 == (QStyleOptionButton *)0x0) break;
    if ((((pQVar17->features).super_QFlagsStorageHelper<QStyleOptionButton::ButtonFeature,_4>.
          super_QFlagsStorage<QStyleOptionButton::ButtonFeature>.i & 2) != 0) &&
       (bVar11 = hasStyleRule(this,&w->super_QObject,7), bVar11)) {
      local_248.d.ptr = (totally_ordered_wrapper<QStyleSheetPositionData_*>)&DAT_aaaaaaaaaaaaaaaa;
      QStack_240 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      local_258 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      QStack_250.d.ptr = (totally_ordered_wrapper<QStyleSheetGeometryData_*>)&DAT_aaaaaaaaaaaaaaaa;
      local_268.d.ptr = (totally_ordered_wrapper<QStyleSheetBackgroundData_*>)&DAT_aaaaaaaaaaaaaaaa;
      QStack_260.d.ptr = (totally_ordered_wrapper<QStyleSheetBorderData_*>)&DAT_aaaaaaaaaaaaaaaa;
      local_278.d.ptr = (totally_ordered_wrapper<QStyleSheetPaletteData_*>)&DAT_aaaaaaaaaaaaaaaa;
      QStack_270.d.ptr = (totally_ordered_wrapper<QStyleSheetBoxData_*>)&DAT_aaaaaaaaaaaaaaaa;
      local_288 = &DAT_aaaaaaaaaaaaaaaa;
      QStack_280.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_298._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_298._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xfffffffffffffd60 = &DAT_aaaaaaaaaaaaaaaa;
      local_2a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionButton::QStyleOptionButton((QStyleOptionButton *)local_2a8,pQVar17);
      local_268.d.ptr =
           (totally_ordered_wrapper<QStyleSheetBackgroundData_*>)
           ((ulong)local_268.d.ptr & 0xfffffffffffffffd);
      bVar11 = QRenderRule::baseStyleCanDraw(&local_c0);
      if (bVar11) {
        pQVar13 = baseStyle(this);
        _local_2c8 = (QRect)(**(code **)(*(long *)pQVar13 + 0xc0))(pQVar13,se,local_2a8,w);
      }
      else {
        _local_2c8 = QWindowsStyle::subElementRect
                               ((QWindowsStyle *)this,se,(QStyleOption *)local_2a8,w);
      }
      QStyleOptionButton::~QStyleOptionButton((QStyleOptionButton *)local_2a8);
      goto LAB_0036e879;
    }
    if ((local_c0.b.d.ptr != (QStyleSheetBoxData *)0x0) ||
       ((local_c0.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
        (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_c0.bd.d.ptr + 0x68))->d).
          ptr != (QStyleSheetBorderImageData *)0x0 ||
         (*(BorderStyle *)((long)local_c0.bd.d.ptr + 0x38) != BorderStyle_Native)))))) {
      LVar21 = opt->direction;
      if (se == SE_PushButtonBevel) {
        _local_2a8 = QRenderRule::borderRect(&local_c0,&opt->rect);
      }
      else {
        _local_2a8 = QRenderRule::contentsRect(&local_c0,&opt->rect);
      }
      goto LAB_0036e64a;
    }
    bVar11 = QRenderRule::baseStyleCanDraw(&local_c0);
    if (!bVar11) goto LAB_0036dabf;
    pQVar13 = baseStyle(this);
    lVar22 = *(long *)pQVar13;
    goto LAB_0036e868;
  case SE_CheckBoxIndicator:
  case SE_RadioButtonIndicator:
    if ((local_c0.bd.d.ptr != (QStyleSheetBorderData *)0x0 ||
         local_c0.b.d.ptr != (QStyleSheetBoxData *)0x0) ||
       (bVar11 = hasStyleRule(this,&w->super_QObject,5), bVar11)) {
      iVar23 = (se != SE_CheckBoxIndicator) + 5;
      memset((QRenderRule *)local_2a8,0xaa,0x88);
      renderRule((QRenderRule *)local_2a8,this,&w->super_QObject,opt,iVar23);
      _local_2c8 = positionRect(this,w,&local_c0,(QRenderRule *)local_2a8,iVar23,&opt->rect,
                                opt->direction);
      goto LAB_0036ebd6;
    }
    break;
  case SE_CheckBoxContents:
  case SE_RadioButtonContents:
    if ((local_c0.bd.d.ptr == (QStyleSheetBorderData *)0x0 &&
         local_c0.b.d.ptr == (QStyleSheetBoxData *)0x0) &&
       (bVar11 = hasStyleRule(this,&w->super_QObject,5), !bVar11)) break;
    local_2a8._8_4_ = 0xaaaaaaaa;
    local_2a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    RStack_29c.m_i = -0x55555556;
    uVar19 = 0x43;
    if (se == SE_RadioButtonContents) {
      uVar19 = 0x4a;
    }
    _local_2a8 = (QRect)(**(code **)(*(long *)this + 0xc0))
                                  (this,(se == SE_RadioButtonContents) * '\x04' + '\x02',opt,w);
    _local_2a8 = QStyle::visualRect(opt->direction,&opt->rect,(QRect *)local_2a8);
    iVar23 = (**(code **)(*(long *)this + 0xe0))(this,uVar19,0,w);
    QVar24 = QRenderRule::contentsRect(&local_c0,&opt->rect);
    iVar20 = local_2a8._8_4_ + 1 + local_2a8._0_4_;
    local_2a8._4_4_ = QVar24.y1.m_i.m_i;
    local_2a8._0_4_ = local_2a8._8_4_ + iVar23 + 1;
    local_2a8._8_4_ = ((iVar20 + QVar24.x2.m_i.m_i) - QVar24.x1.m_i) + ~local_2a8._8_4_;
    RStack_29c.m_i = QVar24.y2.m_i.m_i;
    LVar21 = opt->direction;
LAB_0036e64a:
    _local_2c8 = QStyle::visualRect(LVar21,&opt->rect,(QRect *)local_2a8);
    goto LAB_0036e879;
  case SE_CheckBoxFocusRect:
  case SE_CheckBoxClickRect:
switchD_0036d821_caseD_4:
    goto LAB_0036dabf;
  case SE_RadioButtonFocusRect:
  case SE_RadioButtonClickRect:
    if ((local_c0.bd.d.ptr != (QStyleSheetBorderData *)0x0 ||
         local_c0.b.d.ptr != (QStyleSheetBoxData *)0x0) ||
       (bVar11 = hasStyleRule(this,&w->super_QObject,5), bVar11)) {
LAB_0036da8a:
      _local_2c8 = opt->rect;
      goto LAB_0036e879;
    }
    break;
  case SE_ProgressBarGroove:
  case SE_ProgressBarContents:
  case SE_ProgressBarLabel:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (pQVar14 = opt, opt->type != 6)) {
      pQVar14 = (QStyleOption *)0x0;
    }
    if ((pQVar14 != (QStyleOption *)0x0) &&
       ((((local_c0.b.d.ptr != (QStyleSheetBoxData *)0x0 ||
          ((local_c0.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
           (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_c0.bd.d.ptr + 0x68))->
             d).ptr != (QStyleSheetBorderImageData *)0x0 ||
            (*(BorderStyle *)((long)local_c0.bd.d.ptr + 0x38) != BorderStyle_Native)))))) ||
         (local_c0.p.d.ptr != (QStyleSheetPositionData *)0x0)) ||
        (bVar11 = hasStyleRule(this,&w->super_QObject,0x2d), bVar11)))) {
      if (se == SE_ProgressBarContents) {
        _local_2c8 = QRenderRule::contentsRect(&local_c0,&pQVar14->rect);
      }
      else if (se == SE_ProgressBarGroove) {
        _local_2c8 = QRenderRule::borderRect(&local_c0,&pQVar14->rect);
      }
      else {
        local_2a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        uVar15 = QFontMetrics::size((int)pQVar14 + 0x20,(QString *)0x0,(int)pQVar14 + 0x50,
                                    (int *)0x0);
        local_2a8._0_4_ = (int)uVar15;
        local_2a8._4_4_ = (int)((ulong)uVar15 >> 0x20);
        pQVar18 = &pQVar14[1].palette;
        if (local_c0.p.d.ptr != (QStyleSheetPositionData *)0x0) {
          pQVar18 = (QPalette *)((long)local_c0.p.d.ptr + 0x20);
        }
        _local_2c8 = QStyle::alignedRect(LeftToRight,
                                         (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                                         *(QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)&pQVar18->d,
                                         (QSize *)local_2a8,&pQVar14->rect);
      }
      goto LAB_0036e879;
    }
    break;
  case SE_ToolBoxTabContents:
    if ((w != (QWidget *)0x0) &&
       (bVar11 = hasStyleRule(this,*(QObject **)(*(long *)&w->field_0x8 + 0x10),0x14), bVar11)) {
      memset((QRenderRule *)local_2a8,0xaa,0x88);
      renderRule((QRenderRule *)local_2a8,this,*(QObject **)(*(long *)&w->field_0x8 + 0x10),opt,0x14
                );
      LVar21 = opt->direction;
      local_148._0_16_ = QRenderRule::contentsRect((QRenderRule *)local_2a8,&opt->rect);
      _local_2c8 = QStyle::visualRect(LVar21,&opt->rect,(QRect *)&local_148);
      goto LAB_0036ebd6;
    }
    break;
  case SE_HeaderLabel:
    memset((QRenderRule *)local_2a8,0xaa,0x88);
    renderRule((QRenderRule *)local_2a8,this,&w->super_QObject,opt,0x2a);
    if ((QStack_270.d.ptr != (QStyleSheetBoxData *)0x0) ||
       ((QStack_260.d.ptr != (QStyleSheetBorderData *)0x0 &&
        (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)QStack_260.d.ptr + 0x68))->d).
          ptr != (QStyleSheetBorderImageData *)0x0 ||
         (*(BorderStyle *)((long)QStack_260.d.ptr + 0x38) != BorderStyle_Native)))))) {
      stack0xfffffffffffffd40 = &DAT_aaaaaaaaaaaaaaaa;
      local_2c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      _local_2c8 = QRenderRule::contentsRect((QRenderRule *)local_2a8,&opt->rect);
      if ((opt == (QStyleOption *)0x0) || ((opt->version < 1 || (pQVar14 = opt, opt->type != 8)))) {
        pQVar14 = (QStyleOption *)0x0;
      }
      if ((pQVar14 != (QStyleOption *)0x0) && (*(int *)((long)&pQVar14[1].styleObject + 4) != 0)) {
        auVar25 = (**(code **)(*(long *)this + 0xc0))(this,0x11,opt,w);
        if (auVar25._4_4_ <= (int)auVar25._12_4_ && auVar25._0_4_ <= (int)auVar25._8_4_) {
          if (((opt->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
               super_QFlagsStorage<QStyle::StateFlag>.i & 0x80) == 0) {
            RStack_2bc.m_i = RStack_2bc.m_i + ~auVar25._12_4_ + auVar25._4_4_;
          }
          else {
            local_2c8._8_4_ = local_2c8._8_4_ + ~auVar25._8_4_ + auVar25._0_4_;
          }
        }
      }
      goto LAB_0036ebd6;
    }
LAB_0036e846:
    this_01 = (QRenderRule *)local_2a8;
LAB_0036e84b:
    QRenderRule::~QRenderRule(this_01);
    break;
  case SE_HeaderArrow:
    memset((QRenderRule *)local_2a8,0xaa,0x88);
    renderRule((QRenderRule *)local_2a8,this,&w->super_QObject,opt,0x2b);
    if (QStack_250.d.ptr == (QStyleSheetGeometryData *)0x0 &&
        local_248.d.ptr == (QStyleSheetPositionData *)0x0) goto LAB_0036e846;
    _local_2c8 = positionRect(this,w,&local_c0,(QRenderRule *)local_2a8,0x2b,&opt->rect,
                              opt->direction);
    goto LAB_0036ebd6;
  case SE_TabWidgetTabBar:
    iVar23 = 0x37;
    goto LAB_0036e24f;
  case SE_TabWidgetTabPane:
  case SE_TabWidgetTabContents:
    goto switchD_0036d821_caseD_13;
  case SE_TabWidgetLeftCorner:
    iVar23 = 0x38;
    goto LAB_0036e24f;
  case SE_TabWidgetRightCorner:
    iVar23 = 0x39;
LAB_0036e24f:
    bVar11 = false;
switchD_0036d821_caseD_13:
    iVar20 = 0x36;
    if (!bVar11) {
      iVar20 = iVar23;
    }
    bVar12 = hasStyleRule(this,&w->super_QObject,iVar20);
    if (!bVar12) break;
    sr = SE_TabWidgetTabPane;
    if (!bVar11) {
      sr = se;
    }
    stack0xfffffffffffffd40 = &DAT_aaaaaaaaaaaaaaaa;
    local_2c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    _local_2c8 = QWindowsStyle::subElementRect((QWindowsStyle *)this,sr,opt,w);
    memset(local_2a8,0xaa,0x88);
    renderRule((QRenderRule *)local_2a8,this,&w->super_QObject,opt,iVar20);
    _local_2c8 = positionRect(this,w,(QRenderRule *)local_2a8,iVar20,(QRect *)local_2c8,
                              opt->direction);
    if (iVar20 == 0x37) {
      _local_2c8 = (QRect)QRect::operator&(&opt->rect,(QRect *)local_2c8);
    }
    if (se == SE_TabWidgetTabContents) {
      _local_2c8 = QRenderRule::contentsRect((QRenderRule *)local_2a8,(QRect *)local_2c8);
    }
    QPainterPath::~QPainterPath(local_228);
    QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(local_238);
    QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer
              ((QSharedDataPointer<QStyleSheetImageData> *)&QStack_240);
    if (local_248.d.ptr != (QStyleSheetPositionData *)0x0) {
      LOCK();
      *(int *)local_248.d.ptr = *(int *)local_248.d.ptr + -1;
      UNLOCK();
      if ((*(int *)local_248.d.ptr == 0) && (local_248.d.ptr != (QStyleSheetPositionData *)0x0)) {
        operator_delete((void *)local_248.d.ptr,0x24);
      }
    }
    if (QStack_250.d.ptr != (QStyleSheetGeometryData *)0x0) {
      LOCK();
      *(int *)QStack_250.d.ptr = *(int *)QStack_250.d.ptr + -1;
      UNLOCK();
      if ((*(int *)QStack_250.d.ptr == 0) && (QStack_250.d.ptr != (QStyleSheetGeometryData *)0x0)) {
        operator_delete((void *)QStack_250.d.ptr,0x1c);
      }
    }
    QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer
              ((QSharedDataPointer<QStyleSheetOutlineData> *)&local_258);
    QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&QStack_260);
    QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&local_268);
    if (QStack_270.d.ptr != (QStyleSheetBoxData *)0x0) {
      LOCK();
      *(int *)QStack_270.d.ptr = *(int *)QStack_270.d.ptr + -1;
      UNLOCK();
      if ((*(int *)QStack_270.d.ptr == 0) && (QStack_270.d.ptr != (QStyleSheetBoxData *)0x0)) {
        operator_delete((void *)QStack_270.d.ptr,0x28);
      }
    }
    QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer(&local_278);
    QHash<QString,_QVariant>::~QHash(&QStack_280);
    QFont::~QFont((QFont *)local_298);
    puVar9 = local_2a8;
LAB_0036eb39:
    QBrush::~QBrush((QBrush *)((long)puVar9 + 8));
    goto LAB_0036e879;
  case SE_ItemViewItemCheckIndicator:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (pQVar14 = opt, opt->type != 10)) {
      pQVar14 = (QStyleOption *)0x0;
    }
    if (pQVar14 == (QStyleOption *)0x0) {
      _local_2c8 = (QRect)(**(code **)(*(long *)this + 0xc0))(this,2,opt,w);
      goto LAB_0036e879;
    }
  case SE_ItemViewItemDecoration:
  case SE_ItemViewItemText:
  case SE_ItemViewItemFocusRect:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) ||
       (other = (QStyleOptionViewItem *)opt, opt->type != 10)) {
      other = (QStyleOptionViewItem *)0x0;
    }
    if (other == (QStyleOptionViewItem *)0x0) {
LAB_0036e0ce:
      bVar11 = false;
    }
    else {
      memset(&local_148,0xaa,0x88);
      renderRule(&local_148,this,&w->super_QObject,opt,0x4a);
      iVar23 = 0x4c;
      if ((se & ~SE_PushButtonFocusRect) == SE_ItemViewItemText) {
LAB_0036de69:
        if ((local_148.b.d.ptr != (QStyleSheetBoxData *)0x0 ||
             local_148.geo.d.ptr != (QStyleSheetGeometryData *)0x0) ||
           (((local_148.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
             (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_148.bd.d.ptr + 0x68)
                )->d).ptr != (QStyleSheetBorderImageData *)0x0 ||
              (*(BorderStyle *)((long)local_148.bd.d.ptr + 0x38) != BorderStyle_Native)))) ||
            (bVar11 = hasStyleRule(this,&w->super_QObject,iVar23), bVar11)))) {
          memset(local_1d8,0xaa,0x88);
          renderRule((QRenderRule *)local_1d8,this,&w->super_QObject,opt,iVar23);
          memset((QStyleOptionViewItem *)local_2a8,0xaa,0xd0);
          QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)local_2a8,other);
          local_298 = (undefined1  [16])
                      QRenderRule::contentsRect(&local_148,&(other->super_QStyleOption).rect);
          stack0xfffffffffffffd30 = &DAT_aaaaaaaaaaaaaaaa;
          local_2d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          _local_2d8 = QWindowsStyle::subElementRect
                                 ((QWindowsStyle *)this,se,(QStyleOption *)local_2a8,w);
          _local_2c8 = positionRect(this,w,(QRenderRule *)local_1d8,iVar23,(QRect *)local_2d8,
                                    opt->direction);
          QStyleOptionViewItem::~QStyleOptionViewItem((QStyleOptionViewItem *)local_2a8);
          QRenderRule::~QRenderRule((QRenderRule *)local_1d8);
          bVar11 = true;
          goto LAB_0036dfc9;
        }
        bVar11 = false;
        bVar12 = true;
      }
      else {
        bVar11 = false;
        if (se == SE_ItemViewItemCheckIndicator) {
          iVar23 = 0x4d;
          bVar4 = (byte)(other->features).
                        super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                        super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i & 4;
joined_r0x0036dfc3:
          if (bVar4 != 0) goto LAB_0036de69;
        }
        else if (se == SE_ItemViewItemDecoration) {
          iVar23 = 0x4b;
          bVar4 = (byte)(other->features).
                        super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                        super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i & 0x10;
          goto joined_r0x0036dfc3;
        }
LAB_0036dfc9:
        bVar12 = false;
      }
      QPainterPath::~QPainterPath((QPainterPath *)((long)&local_148 + 0x80));
      QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer
                ((QSharedDataPointer<QStyleSheetImageData> *)((long)&local_148 + 0x70));
      QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer
                ((QSharedDataPointer<QStyleSheetImageData> *)((long)&local_148 + 0x68));
      if (local_148.p.d.ptr != (QStyleSheetPositionData *)0x0) {
        LOCK();
        *(int *)local_148.p.d.ptr = *(int *)local_148.p.d.ptr + -1;
        UNLOCK();
        if ((*(int *)local_148.p.d.ptr == 0) &&
           (local_148.p.d.ptr != (QStyleSheetPositionData *)0x0)) {
          operator_delete((void *)local_148.p.d.ptr,0x24);
        }
      }
      if (local_148.geo.d.ptr != (QStyleSheetGeometryData *)0x0) {
        LOCK();
        *(int *)local_148.geo.d.ptr = *(int *)local_148.geo.d.ptr + -1;
        UNLOCK();
        if ((*(int *)local_148.geo.d.ptr == 0) &&
           (local_148.geo.d.ptr != (QStyleSheetGeometryData *)0x0)) {
          operator_delete((void *)local_148.geo.d.ptr,0x1c);
        }
      }
      QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer
                ((QSharedDataPointer<QStyleSheetOutlineData> *)((long)&local_148 + 0x50));
      QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer
                ((QSharedDataPointer<QStyleSheetBorderData> *)((long)&local_148 + 0x48));
      QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer
                ((QSharedDataPointer<QStyleSheetBackgroundData> *)((long)&local_148 + 0x40));
      if (local_148.b.d.ptr != (QStyleSheetBoxData *)0x0) {
        LOCK();
        *(int *)local_148.b.d.ptr = *(int *)local_148.b.d.ptr + -1;
        UNLOCK();
        if ((*(int *)local_148.b.d.ptr == 0) && (local_148.b.d.ptr != (QStyleSheetBoxData *)0x0)) {
          operator_delete((void *)local_148.b.d.ptr,0x28);
        }
      }
      QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer
                ((QSharedDataPointer<QStyleSheetPaletteData> *)((long)&local_148 + 0x30));
      QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)((long)&local_148 + 0x28));
      QFont::~QFont((QFont *)((long)&local_148 + 0x10));
      QBrush::~QBrush((QBrush *)((long)&local_148 + 8));
      if (bVar12) goto LAB_0036e0ce;
    }
    if (!bVar11) break;
    goto LAB_0036e879;
  case SE_TabBarTearIndicator:
    memset((QRenderRule *)local_2a8,0xaa,0x88);
    renderRule((QRenderRule *)local_2a8,this,&w->super_QObject,opt,0x30);
    if ((QStack_250.d.ptr == (QStyleSheetGeometryData *)0x0) ||
       ((bVar11 = true, *(int *)((long)QStack_250.d.ptr + 0xc) == -1 &&
        (*(int *)((long)QStack_250.d.ptr + 0x10) == -1)))) {
      if (QStack_240 == (QSize)0x0) {
        bVar11 = false;
      }
      else {
        bVar11 = -1 < (int)(*(uint *)((long)QStack_240 + 0x18) | *(uint *)((long)QStack_240 + 0x14))
        ;
      }
    }
    if (!bVar11) goto LAB_0036e846;
    _local_2c8 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (pQVar14 = opt, opt->type != 3)) {
      pQVar14 = (QStyleOption *)0x0;
    }
    if (pQVar14 != (QStyleOption *)0x0) {
      if ((uint)pQVar14[1].version < 8) {
        if ((0x33U >> (pQVar14[1].version & 0x1fU) & 1) == 0) {
          pQVar1 = &pQVar14->rect;
          iVar23 = (pQVar1->x1).m_i;
          iVar20 = (pQVar14->rect).y1.m_i;
          uVar7 = pQVar1->x1;
          uVar8 = pQVar1->y1;
          local_2c8._4_4_ = uVar8;
          local_2c8._0_4_ = uVar7;
          uVar15 = local_2c8._0_8_;
          iVar2 = (opt->rect).x2.m_i;
          iVar3 = (opt->rect).x1.m_i;
          QVar16 = QRenderRule::size((QRenderRule *)local_2a8);
          local_2c8._8_4_ = (iVar2 + iVar23) - iVar3;
          local_2c8 = CONCAT48(local_2c8._8_4_,uVar15);
          RStack_2bc.m_i = iVar20 + QVar16.ht.m_i.m_i + -1;
        }
        else {
          pQVar1 = &pQVar14->rect;
          iVar23 = (pQVar1->x1).m_i;
          iVar20 = (pQVar14->rect).y1.m_i;
          uVar5 = pQVar1->x1;
          uVar6 = pQVar1->y1;
          local_2c8._4_4_ = uVar6;
          local_2c8._0_4_ = uVar5;
          uVar15 = local_2c8._0_8_;
          QVar16 = QRenderRule::size((QRenderRule *)local_2a8);
          RStack_2bc.m_i = ((opt->rect).y2.m_i + iVar20) - (opt->rect).y1.m_i;
          local_2c8._8_4_ = QVar16.wd.m_i.m_i + iVar23 + -1;
          local_2c8 = CONCAT48(local_2c8._8_4_,uVar15);
        }
      }
      _local_2c8 = QStyle::visualRect(opt->direction,&opt->rect,(QRect *)local_2c8);
    }
    QRenderRule::~QRenderRule((QRenderRule *)local_2a8);
    if (bVar11) goto LAB_0036e879;
    break;
  case SE_LineEditContents:
  case SE_FrameContents:
  case SE_ShapedFrameContents:
    if ((local_c0.b.d.ptr != (QStyleSheetBoxData *)0x0) ||
       ((local_c0.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
        (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_c0.bd.d.ptr + 0x68))->d).
          ptr != (QStyleSheetBorderImageData *)0x0 ||
         (*(BorderStyle *)((long)local_c0.bd.d.ptr + 0x38) != BorderStyle_Native)))))) {
      LVar21 = opt->direction;
      _local_2a8 = QRenderRule::contentsRect(&local_c0,&opt->rect);
      goto LAB_0036e64a;
    }
    break;
  case SE_DockWidgetCloseButton:
  case SE_DockWidgetFloatButton:
    iVar23 = (se != SE_DockWidgetCloseButton) + 0x3b;
    memset((QRenderRule *)local_2a8,0xaa,0x88);
    renderRule((QRenderRule *)local_2a8,this,&w->super_QObject,opt,iVar23);
    if (local_248.d.ptr == (QStyleSheetPositionData *)0x0) goto LAB_0036e846;
    memset(&local_148,0xaa,0x88);
    renderRule(&local_148,this,&w->super_QObject,opt,0x3a);
    _local_2c8 = positionRect(this,w,&local_148,(QRenderRule *)local_2a8,iVar23,&opt->rect,
                              opt->direction);
    QRenderRule::~QRenderRule(&local_148);
LAB_0036ebd6:
    QRenderRule::~QRenderRule((QRenderRule *)local_2a8);
    goto LAB_0036e879;
  case SE_CheckBoxLayoutItem:
  case SE_ComboBoxLayoutItem:
  case SE_DateTimeEditLayoutItem:
  case SE_LabelLayoutItem:
  case SE_ProgressBarLayoutItem:
  case SE_PushButtonLayoutItem:
  case SE_RadioButtonLayoutItem:
  case SE_SliderLayoutItem:
  case SE_SpinBoxLayoutItem:
  case SE_ToolButtonLayoutItem:
  case SE_FrameLayoutItem:
  case SE_GroupBoxLayoutItem:
  case SE_TabWidgetLayoutItem:
    if ((local_c0.bd.d.ptr != (QStyleSheetBorderData *)0x0) &&
       (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_c0.bd.d.ptr + 0x68))->d).
         ptr != (QStyleSheetBorderImageData *)0x0 ||
        (*(BorderStyle *)((long)local_c0.bd.d.ptr + 0x38) != BorderStyle_Native))))
    goto LAB_0036da8a;
    break;
  case SE_TabBarTabLeftButton:
  case SE_TabBarTabRightButton:
  case SE_TabBarTabText:
    memset(&local_148,0xaa,0x88);
    renderRule(&local_148,this,&w->super_QObject,opt,0x2e);
    if ((local_148.b.d.ptr == (QStyleSheetBoxData *)0x0) &&
       (((local_148.bd.d.ptr == (QStyleSheetBorderData *)0x0 ||
         (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_148.bd.d.ptr + 0x68))->d
           ).ptr == (QStyleSheetBorderImageData *)0x0 &&
          (*(BorderStyle *)((long)local_148.bd.d.ptr + 0x38) == BorderStyle_Native)))) &&
        (local_148.hasFont != true)))) {
      this_01 = &local_148;
      goto LAB_0036e84b;
    }
    if (se == SE_TabBarTabText) {
      if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) ||
         (other_00 = (QStyleOptionTab *)opt, opt->type != 3)) {
        other_00 = (QStyleOptionTab *)0x0;
      }
      if (other_00 == (QStyleOptionTab *)0x0) goto LAB_0036dd22;
      this_00 = (QTabBar *)QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
      local_1d8._8_4_ = 0xaaaaaaaa;
      local_1d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_1d8._12_4_ = -0x55555556;
      if ((this_00 == (QTabBar *)0x0) || (other_00->tabIndex == -1)) {
        local_1d8._0_16_ = *(undefined1 (*) [16])&opt->rect;
      }
      else {
        local_1d8._0_16_ = (undefined1  [16])QTabBar::tabRect(this_00,other_00->tabIndex);
      }
      local_2d8._8_4_ = 0xaaaaaaaa;
      local_2d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      RStack_2cc.m_i = -0x55555556;
      _local_2d8 = positionRect(this,w,&local_148,0x2e,(QRect *)local_1d8,opt->direction);
      memset((QStyleOptionTab *)local_2a8,0xaa,0xa0);
      QStyleOptionTab::QStyleOptionTab((QStyleOptionTab *)local_2a8,other_00);
      if (local_148.hasFont == true) {
        local_2b8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_2b0 = &DAT_aaaaaaaaaaaaaaaa;
        if (w == (QWidget *)0x0) {
          QFont::QFont((QFont *)&local_2b8,(QFont *)((long)&local_148 + 0x10));
        }
        else {
          QFont::resolve((QFont *)&local_2b8);
        }
        QFontMetrics::QFontMetrics((QFontMetrics *)&local_2e0,(QFont *)&local_2b8);
        puVar9 = local_288;
        local_288 = local_2e0;
        local_2e0 = puVar9;
        QFontMetrics::~QFontMetrics((QFontMetrics *)&local_2e0);
        QFont::~QFont((QFont *)&local_2b8);
      }
      local_298 = (undefined1  [16])QRenderRule::contentsRect(&local_148,(QRect *)local_2d8);
      _local_2c8 = QWindowsStyle::subElementRect
                             ((QWindowsStyle *)this,SE_TabBarTabText,(QStyleOption *)local_2a8,w);
      QStyleOptionTab::~QStyleOptionTab((QStyleOptionTab *)local_2a8);
    }
    else {
LAB_0036dd22:
      _local_2c8 = QWindowsStyle::subElementRect((QWindowsStyle *)this,se,opt,w);
    }
    QPainterPath::~QPainterPath((QPainterPath *)((long)&local_148 + 0x80));
    QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer
              ((QSharedDataPointer<QStyleSheetImageData> *)((long)&local_148 + 0x70));
    QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer
              ((QSharedDataPointer<QStyleSheetImageData> *)((long)&local_148 + 0x68));
    if (local_148.p.d.ptr != (QStyleSheetPositionData *)0x0) {
      LOCK();
      *(int *)local_148.p.d.ptr = *(int *)local_148.p.d.ptr + -1;
      UNLOCK();
      if ((*(int *)local_148.p.d.ptr == 0) && (local_148.p.d.ptr != (QStyleSheetPositionData *)0x0))
      {
        operator_delete((void *)local_148.p.d.ptr,0x24);
      }
    }
    if (local_148.geo.d.ptr != (QStyleSheetGeometryData *)0x0) {
      LOCK();
      *(int *)local_148.geo.d.ptr = *(int *)local_148.geo.d.ptr + -1;
      UNLOCK();
      if ((*(int *)local_148.geo.d.ptr == 0) &&
         (local_148.geo.d.ptr != (QStyleSheetGeometryData *)0x0)) {
        operator_delete((void *)local_148.geo.d.ptr,0x1c);
      }
    }
    QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer
              ((QSharedDataPointer<QStyleSheetOutlineData> *)((long)&local_148 + 0x50));
    QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer
              ((QSharedDataPointer<QStyleSheetBorderData> *)((long)&local_148 + 0x48));
    QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer
              ((QSharedDataPointer<QStyleSheetBackgroundData> *)((long)&local_148 + 0x40));
    if (local_148.b.d.ptr != (QStyleSheetBoxData *)0x0) {
      LOCK();
      *(int *)local_148.b.d.ptr = *(int *)local_148.b.d.ptr + -1;
      UNLOCK();
      if ((*(int *)local_148.b.d.ptr == 0) && (local_148.b.d.ptr != (QStyleSheetBoxData *)0x0)) {
        operator_delete((void *)local_148.b.d.ptr,0x28);
      }
    }
    QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer
              ((QSharedDataPointer<QStyleSheetPaletteData> *)((long)&local_148 + 0x30));
    QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)((long)&local_148 + 0x28));
    QFont::~QFont((QFont *)((long)&local_148 + 0x10));
    puVar9 = (undefined1 *)&local_148;
    goto LAB_0036eb39;
  case SE_ToolBarHandle:
    bVar11 = hasStyleRule(this,&w->super_QObject,0x21);
    if (!bVar11) break;
    se = SE_ToolBarHandle;
LAB_0036dabf:
    _local_2c8 = QWindowsStyle::subElementRect
                           ((QWindowsStyle *)this,se,&pQVar17->super_QStyleOption,w);
    goto LAB_0036e879;
  case SE_TabBarScrollLeftButton:
  case SE_TabBarScrollRightButton:
    bVar11 = hasStyleRule(this,&w->super_QObject,0x2f);
    if (bVar11) goto switchD_0036d821_caseD_4;
  }
  pQVar13 = baseStyle(this);
  lVar22 = *(long *)pQVar13;
  pQVar17 = (QStyleOptionButton *)opt;
LAB_0036e868:
  _local_2c8 = (QRect)(**(code **)(lVar22 + 0xc0))(pQVar13,se,pQVar17,w);
LAB_0036e879:
  QPainterPath::~QPainterPath(&local_c0.clipPath);
  QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_c0.iconPtr);
  QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_c0.img);
  if (local_c0.p.d.ptr != (QStyleSheetPositionData *)0x0) {
    LOCK();
    *(int *)local_c0.p.d.ptr = *(int *)local_c0.p.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_c0.p.d.ptr == 0) && (local_c0.p.d.ptr != (QStyleSheetPositionData *)0x0)) {
      operator_delete((void *)local_c0.p.d.ptr,0x24);
    }
  }
  if (local_c0.geo.d.ptr != (QStyleSheetGeometryData *)0x0) {
    LOCK();
    *(int *)local_c0.geo.d.ptr = *(int *)local_c0.geo.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_c0.geo.d.ptr == 0) && (local_c0.geo.d.ptr != (QStyleSheetGeometryData *)0x0))
    {
      operator_delete((void *)local_c0.geo.d.ptr,0x1c);
    }
  }
  QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&local_c0.ou);
  QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&local_c0.bd);
  QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&local_c0.bg);
  if (local_c0.b.d.ptr != (QStyleSheetBoxData *)0x0) {
    LOCK();
    *(int *)local_c0.b.d.ptr = *(int *)local_c0.b.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_c0.b.d.ptr == 0) && (local_c0.b.d.ptr != (QStyleSheetBoxData *)0x0)) {
      operator_delete((void *)local_c0.b.d.ptr,0x28);
    }
  }
  QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer(&local_c0.pal);
  QHash<QString,_QVariant>::~QHash(&local_c0.styleHints);
  QFont::~QFont(&local_c0.font);
  QBrush::~QBrush(&local_c0.defaultBackground);
  if (pQVar10 == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)0x0;
  }
LAB_0036e987:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return _local_2c8;
}

Assistant:

QRect QStyleSheetStyle::subElementRect(SubElement se, const QStyleOption *opt, const QWidget *w) const
{
    RECURSION_GUARD(return baseStyle()->subElementRect(se, opt, w))

    QRenderRule rule = renderRule(w, opt);
#if QT_CONFIG(tabbar)
    int pe = PseudoElement_None;
#endif

    switch (se) {
    case SE_PushButtonContents:
    case SE_PushButtonBevel:
    case SE_PushButtonFocusRect:
        if (const QStyleOptionButton *btn = qstyleoption_cast<const QStyleOptionButton *>(opt)) {
            if (btn->features & QStyleOptionButton::HasMenu
                && hasStyleRule(w, PseudoElement_PushButtonMenuIndicator)) {
                QStyleOptionButton btnOpt(*btn);
                btnOpt.features &= ~QStyleOptionButton::HasMenu;
                return rule.baseStyleCanDraw() ? baseStyle()->subElementRect(se, &btnOpt, w)
                                               : QWindowsStyle::subElementRect(se, &btnOpt, w);
            }
            if (rule.hasBox() || !rule.hasNativeBorder()) {
                return visualRect(opt->direction, opt->rect, se == SE_PushButtonBevel
                                                                ? rule.borderRect(opt->rect)
                                                                : rule.contentsRect(opt->rect));
            }
            return rule.baseStyleCanDraw() ? baseStyle()->subElementRect(se, btn, w)
                                           : QWindowsStyle::subElementRect(se, btn, w);
        }
        break;

    case SE_LineEditContents:
    case SE_FrameContents:
    case SE_ShapedFrameContents:
        if (rule.hasBox() || !rule.hasNativeBorder()) {
            return visualRect(opt->direction, opt->rect, rule.contentsRect(opt->rect));
        }
        break;

    case SE_CheckBoxIndicator:
    case SE_RadioButtonIndicator:
        if (rule.hasBox() || rule.hasBorder() || hasStyleRule(w, PseudoElement_Indicator)) {
            PseudoElement pe = se == SE_CheckBoxIndicator ? PseudoElement_Indicator : PseudoElement_ExclusiveIndicator;
            QRenderRule subRule = renderRule(w, opt, pe);
            return positionRect(w, rule, subRule, pe, opt->rect, opt->direction);
        }
        break;

    case SE_CheckBoxContents:
    case SE_RadioButtonContents:
        if (rule.hasBox() || rule.hasBorder() || hasStyleRule(w, PseudoElement_Indicator)) {
            bool isRadio = se == SE_RadioButtonContents;
            QRect ir = subElementRect(isRadio ? SE_RadioButtonIndicator : SE_CheckBoxIndicator,
                                      opt, w);
            ir = visualRect(opt->direction, opt->rect, ir);
            int spacing = pixelMetric(isRadio ? PM_RadioButtonLabelSpacing : PM_CheckBoxLabelSpacing, nullptr, w);
            QRect cr = rule.contentsRect(opt->rect);
            ir.setRect(ir.left() + ir.width() + spacing, cr.y(),
                       cr.width() - ir.width() - spacing, cr.height());
            return visualRect(opt->direction, opt->rect, ir);
        }
        break;

    case SE_ToolBoxTabContents:
        if (w && hasStyleRule(w->parentWidget(), PseudoElement_ToolBoxTab)) {
            QRenderRule subRule = renderRule(w->parentWidget(), opt, PseudoElement_ToolBoxTab);
            return visualRect(opt->direction, opt->rect, subRule.contentsRect(opt->rect));
        }
        break;

    case SE_RadioButtonFocusRect:
    case SE_RadioButtonClickRect: // focusrect | indicator
        if (rule.hasBox() || rule.hasBorder() || hasStyleRule(w, PseudoElement_Indicator)) {
            return opt->rect;
        }
        break;

    case SE_CheckBoxFocusRect:
    case SE_CheckBoxClickRect: // relies on indicator and contents
        return ParentStyle::subElementRect(se, opt, w);

#if QT_CONFIG(itemviews)
    case SE_ItemViewItemCheckIndicator:
        if (!qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            return subElementRect(SE_CheckBoxIndicator, opt, w);
        }
        Q_FALLTHROUGH();
    case SE_ItemViewItemText:
    case SE_ItemViewItemDecoration:
    case SE_ItemViewItemFocusRect:
        if (const QStyleOptionViewItem *vopt = qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            QRenderRule subRule = renderRule(w, opt, PseudoElement_ViewItem);
            PseudoElement pe = PseudoElement_None;
            if (se == SE_ItemViewItemText || se == SE_ItemViewItemFocusRect)
                pe = PseudoElement_ViewItemText;
            else if (se == SE_ItemViewItemDecoration && vopt->features & QStyleOptionViewItem::HasDecoration)
                pe = PseudoElement_ViewItemIcon;
            else if (se == SE_ItemViewItemCheckIndicator && vopt->features & QStyleOptionViewItem::HasCheckIndicator)
                pe = PseudoElement_ViewItemIndicator;
            else
                break;
            if (subRule.hasGeometry() || subRule.hasBox() || !subRule.hasNativeBorder() || hasStyleRule(w, pe)) {
                QRenderRule subRule2 = renderRule(w, opt, pe);
                QStyleOptionViewItem optCopy(*vopt);
                optCopy.rect = subRule.contentsRect(vopt->rect);
                QRect rect = ParentStyle::subElementRect(se, &optCopy, w);
                return positionRect(w, subRule2, pe, rect, opt->direction);
            }
         }
        break;
#endif // QT_CONFIG(itemviews)

    case SE_HeaderArrow: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_HeaderViewUpArrow);
        if (subRule.hasPosition() || subRule.hasGeometry())
            return positionRect(w, rule, subRule, PseudoElement_HeaderViewUpArrow, opt->rect, opt->direction);
                         }
        break;

    case SE_HeaderLabel: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_HeaderViewSection);
        if (subRule.hasBox() || !subRule.hasNativeBorder()) {
            auto r = subRule.contentsRect(opt->rect);
            if (const QStyleOptionHeader *header = qstyleoption_cast<const QStyleOptionHeader *>(opt)) {
                // Subtract width needed for arrow, if there is one
                if (header->sortIndicator != QStyleOptionHeader::None) {
                    const auto arrowRect = subElementRect(SE_HeaderArrow, opt, w);
                    if (arrowRect.isValid()) {
                        if (opt->state & State_Horizontal)
                            r.setWidth(r.width() - arrowRect.width());
                        else
                            r.setHeight(r.height() - arrowRect.height());
                    }
                }
            }
            return r;
        }
                         }
        break;

    case SE_ProgressBarGroove:
    case SE_ProgressBarContents:
    case SE_ProgressBarLabel:
        if (const QStyleOptionProgressBar *pb = qstyleoption_cast<const QStyleOptionProgressBar *>(opt)) {
            if (rule.hasBox() || !rule.hasNativeBorder() || rule.hasPosition() || hasStyleRule(w, PseudoElement_ProgressBarChunk)) {
                if (se == SE_ProgressBarGroove)
                    return rule.borderRect(pb->rect);
                else if (se == SE_ProgressBarContents)
                    return rule.contentsRect(pb->rect);

                QSize sz = pb->fontMetrics.size(0, pb->text);
                return QStyle::alignedRect(Qt::LeftToRight, rule.hasPosition() ? rule.position()->textAlignment : pb->textAlignment,
                                           sz, pb->rect);
            }
        }
        break;

#if QT_CONFIG(tabbar)
    case SE_TabWidgetLeftCorner:
        pe = PseudoElement_TabWidgetLeftCorner;
        Q_FALLTHROUGH();
    case SE_TabWidgetRightCorner:
        if (pe == PseudoElement_None)
            pe = PseudoElement_TabWidgetRightCorner;
        Q_FALLTHROUGH();
    case SE_TabWidgetTabBar:
        if (pe == PseudoElement_None)
            pe = PseudoElement_TabWidgetTabBar;
        Q_FALLTHROUGH();
    case SE_TabWidgetTabPane:
    case SE_TabWidgetTabContents:
        if (pe == PseudoElement_None)
            pe = PseudoElement_TabWidgetPane;

        if (hasStyleRule(w, pe)) {
            QRect r = QWindowsStyle::subElementRect(pe == PseudoElement_TabWidgetPane ? SE_TabWidgetTabPane : se, opt, w);
            QRenderRule subRule = renderRule(w, opt, pe);
            r = positionRect(w, subRule, pe, r, opt->direction);
            if (pe == PseudoElement_TabWidgetTabBar) {
                Q_ASSERT(opt);
                r = opt->rect.intersected(r);
            }
            if (se == SE_TabWidgetTabContents)
                r = subRule.contentsRect(r);
            return r;
        }
        break;

    case SE_TabBarScrollLeftButton:
    case SE_TabBarScrollRightButton:
        if (hasStyleRule(w, PseudoElement_TabBarScroller))
            return ParentStyle::subElementRect(se, opt, w);
        break;

    case SE_TabBarTearIndicator: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_TabBarTear);
        if (subRule.hasContentsSize()) {
            QRect r;
            if (const QStyleOptionTab *tab = qstyleoption_cast<const QStyleOptionTab *>(opt)) {
                switch (tab->shape) {
                case QTabBar::RoundedNorth:
                case QTabBar::TriangularNorth:
                case QTabBar::RoundedSouth:
                case QTabBar::TriangularSouth:
                    r.setRect(tab->rect.left(), tab->rect.top(), subRule.size().width(), opt->rect.height());
                    break;
                case QTabBar::RoundedWest:
                case QTabBar::TriangularWest:
                case QTabBar::RoundedEast:
                case QTabBar::TriangularEast:
                    r.setRect(tab->rect.left(), tab->rect.top(), opt->rect.width(), subRule.size().height());
                    break;
                default:
                    break;
                }
                r = visualRect(opt->direction, opt->rect, r);
            }
            return r;
        }
        break;
    }
    case SE_TabBarTabText:
    case SE_TabBarTabLeftButton:
    case SE_TabBarTabRightButton: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_TabBarTab);
        if (subRule.hasBox() || !subRule.hasNativeBorder() || subRule.hasFont) {
            if (se == SE_TabBarTabText) {
                if (const QStyleOptionTab *tab = qstyleoption_cast<const QStyleOptionTab *>(opt)) {
                    const QTabBar *bar = qobject_cast<const QTabBar *>(w);
                    const QRect optRect = bar && tab->tabIndex != -1 ? bar->tabRect(tab->tabIndex) : opt->rect;
                    const QRect r = positionRect(w, subRule, PseudoElement_TabBarTab, optRect, opt->direction);
                    QStyleOptionTab tabCopy(*tab);
                    if (subRule.hasFont) {
                        const QFont ruleFont = w ? subRule.font.resolve(w->font()) : subRule.font;
                        tabCopy.fontMetrics = QFontMetrics(ruleFont);
                    }
                    tabCopy.rect = subRule.contentsRect(r);
                    return ParentStyle::subElementRect(se, &tabCopy, w);
                }
            }
            return ParentStyle::subElementRect(se, opt, w);
        }
        break;
    }
#endif // QT_CONFIG(tabbar)

    case SE_DockWidgetCloseButton:
    case SE_DockWidgetFloatButton: {
        PseudoElement pe = (se == SE_DockWidgetCloseButton) ? PseudoElement_DockWidgetCloseButton : PseudoElement_DockWidgetFloatButton;
        QRenderRule subRule2 = renderRule(w, opt, pe);
        if (!subRule2.hasPosition())
            break;
        QRenderRule subRule = renderRule(w, opt, PseudoElement_DockWidgetTitle);
        return positionRect(w, subRule, subRule2, pe, opt->rect, opt->direction);
                                   }

#if QT_CONFIG(toolbar)
    case SE_ToolBarHandle:
        if (hasStyleRule(w, PseudoElement_ToolBarHandle))
            return ParentStyle::subElementRect(se, opt, w);
        break;
#endif // QT_CONFIG(toolbar)

    // On mac we make pixel adjustments to layouts which are not
    // desirable when you have custom style sheets on them
    case SE_CheckBoxLayoutItem:
    case SE_ComboBoxLayoutItem:
    case SE_DateTimeEditLayoutItem:
    case SE_LabelLayoutItem:
    case SE_ProgressBarLayoutItem:
    case SE_PushButtonLayoutItem:
    case SE_RadioButtonLayoutItem:
    case SE_SliderLayoutItem:
    case SE_SpinBoxLayoutItem:
    case SE_ToolButtonLayoutItem:
    case SE_FrameLayoutItem:
    case SE_GroupBoxLayoutItem:
    case SE_TabWidgetLayoutItem:
        if (!rule.hasNativeBorder())
            return opt->rect;
        break;

    default:
        break;
    }

    return baseStyle()->subElementRect(se, opt, w);
}